

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_deallocate(Integer g_a)

{
  int iVar1;
  int iVar2;
  global_array_t *pgVar3;
  cache_struct_t *pcVar4;
  long grp_id;
  char *pcVar5;
  long lVar6;
  cache_struct *pcVar7;
  logical lVar8;
  long lVar9;
  bool bVar10;
  
  iVar2 = _ga_sync_end;
  bVar10 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  iVar1 = GA[g_a + 1000].p_handle;
  grp_id = (long)iVar1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar10) {
    pnga_pgroup_sync(grp_id);
  }
  lVar6 = GAme;
  if (0 < iVar1) {
    lVar6 = (long)PGRP_LIST[grp_id].map_proc_list[GAme];
  }
  lVar8 = 0;
  if ((-0x3e9 < g_a) && (lVar9 = g_a + 1000, lVar9 < _max_global_array)) {
    if (GA[lVar9].actv == 0) {
      lVar8 = 0;
    }
    else {
      free(GA[lVar9].cache);
      GA[lVar9].cache = (double *)0x0;
      pgVar3 = GA;
      GA[lVar9].actv = 0;
      if ((pgVar3[lVar9].property == 2) &&
         (pcVar4 = pgVar3[lVar9].cache_head, pcVar7 = pcVar4, pcVar4 != (cache_struct_t *)0x0)) {
        while( true ) {
          pcVar7 = pcVar7->next;
          free(pcVar4->cache_buf);
          free(GA[lVar9].cache_head);
          pgVar3 = GA;
          if (pcVar7 == (cache_struct *)0x0) break;
          GA[lVar9].cache_head = pcVar7;
          pcVar4 = GA[lVar9].cache_head;
        }
      }
      pgVar3[lVar9].cache_head = (cache_struct_t *)0x0;
      pcVar5 = GA[lVar9].ptr[lVar6];
      lVar8 = 1;
      if (pcVar5 != (char *)0x0) {
        if (GA[lVar9].overlay == 0) {
          if (iVar1 < 1) {
            pcVar5 = GA[lVar9].ptr[GAme] + -GA[lVar9].id;
            if (GA[lVar9].mem_dev_set == 0) {
              ARMCI_Free(pcVar5);
            }
            else {
              ARMCI_Free_memdev(pcVar5);
            }
          }
          else {
            ARMCI_Free_group(pcVar5 + -GA[lVar9].id,&PGRP_LIST[grp_id].group);
          }
          if (GA_memory_limited == '\x01') {
            GA_total_memory = GA_total_memory + GA[lVar9].size;
          }
          GAstat.curmem = GAstat.curmem - GA[lVar9].size;
        }
        else {
          puts("Warning: Trying to deallocate an overlay array");
          GA[lVar9].overlay = 0;
        }
        if (iVar2 != 0) {
          pnga_pgroup_sync(grp_id);
        }
      }
    }
  }
  return lVar8;
}

Assistant:

logical pnga_deallocate(Integer g_a)
{
  Integer ga_handle = GA_OFFSET + g_a, grp_id, grp_me=GAme;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  grp_id = (Integer)GA[ga_handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(grp_id);

  if (grp_id > 0) grp_me = PGRP_LIST[grp_id].map_proc_list[GAme];
  else grp_me=GAme;

  /* fails if handle is out of range or array not active */
  if(ga_handle < 0 || ga_handle >= _max_global_array){
    return FALSE;
  }
  if(GA[ga_handle].actv==0){
    return FALSE;
  }
  if (GA[ga_handle].cache)
    free(GA[ga_handle].cache);
  GA[ga_handle].cache = NULL;
  GA[ga_handle].actv = 0;     

  if (GA[ga_handle].property == READ_CACHE) {
    if (GA[ga_handle].cache_head != NULL) {
      cache_struct_t *next;
      next = GA[ga_handle].cache_head->next;
      if (GA[ga_handle].cache_head->cache_buf)
        free(GA[ga_handle].cache_head->cache_buf);
      free(GA[ga_handle].cache_head);
      while (next) {
        GA[ga_handle].cache_head = next;
        next = next->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
      }
    }
  }
  GA[ga_handle].cache_head = NULL;

  if(GA[ga_handle].ptr[grp_me]==NULL){
    return TRUE;
  } 
  if (!GA[ga_handle].overlay) {
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)grp_id)){
#endif
      /* make sure that we free original (before address allignment) pointer */
#ifdef MSG_COMMS_MPI
      if (grp_id > 0){
        ARMCI_Free_group(GA[ga_handle].ptr[grp_me] - GA[ga_handle].id,
            &PGRP_LIST[grp_id].group);
      }
      else
#endif
        if (GA[ga_handle].mem_dev_set) {
          ARMCI_Free_memdev(GA[ga_handle].ptr[GAme]-GA[ga_handle].id);
        } else {
          ARMCI_Free(GA[ga_handle].ptr[GAme] - GA[ga_handle].id);
        }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif
    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
  } else {
    printf("Warning: Trying to deallocate an overlay array\n");
    GA[ga_handle].overlay = 0;
  }


  if(local_sync_end)pnga_pgroup_sync(grp_id);
  return(TRUE);
}